

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.c
# Opt level: O0

void DrawRectangleRounded(Rectangle rec,float roundness,int segments,Color color)

{
  Vector2 VVar1;
  float fVar2;
  float x;
  float y;
  float x_00;
  float y_00;
  float x_01;
  float y_01;
  float x_02;
  float y_02;
  float fVar3;
  float fVar4;
  float local_e0;
  int local_dc;
  float fStack_d8;
  int i;
  Vector2 center;
  float angle;
  int k;
  float angles [4];
  Vector2 centers [4];
  Vector2 point [12];
  float stepLength;
  float th;
  float radius;
  int segments_local;
  float roundness_local;
  Color color_local;
  Rectangle rec_local;
  
  roundness_local = rec.x;
  color_local = (Color)rec.y;
  rec_local.x = rec.width;
  rec_local.y = rec.height;
  if (((roundness <= 0.0) || (rec_local.x < 1.0)) || (rec_local.y < 1.0)) {
    DrawRectangleRec(rec,color);
  }
  else {
    radius = roundness;
    if (1.0 <= roundness) {
      radius = 1.0;
    }
    fVar2 = rec_local.x;
    if (rec_local.y < rec_local.x) {
      fVar2 = rec_local.y;
    }
    local_e0 = (fVar2 * radius) / 2.0;
    if (0.0 < local_e0) {
      th = (float)segments;
      if (segments < 4) {
        fVar2 = powf(1.0 - 0.5 / local_e0,2.0);
        fVar2 = acosf(fVar2 + fVar2 + -1.0);
        fVar2 = ceilf(6.2831855 / fVar2);
        th = (float)(int)(fVar2 / 4.0);
        if ((int)th < 1) {
          th = 5.60519e-45;
        }
      }
      fVar2 = 90.0 / (float)(int)th;
      x = roundness_local + local_e0;
      y = (float)color_local + local_e0;
      x_00 = (roundness_local + rec_local.x) - local_e0;
      y_00 = (float)color_local + local_e0;
      x_01 = (roundness_local + rec_local.x) - local_e0;
      y_01 = ((float)color_local + rec_local.y) - local_e0;
      x_02 = roundness_local + local_e0;
      y_02 = ((float)color_local + rec_local.y) - local_e0;
      angles[3] = y;
      angles[2] = x;
      _angle = 0x42b4000043340000;
      angles[0] = 0.0;
      angles[1] = 270.0;
      rlCheckRenderBatchLimit(((int)th << 4) / 2 + 0x14);
      rlSetTexture(texShapes.id);
      rlBegin(7);
      center.y = 0.0;
      while( true ) {
        segments_local._0_1_ = color.r;
        segments_local._1_1_ = color.g;
        segments_local._2_1_ = color.b;
        segments_local._3_1_ = color.a;
        if (3 < (int)center.y) break;
        center.x = (&angle)[(int)center.y];
        VVar1 = centers[(long)(int)center.y + -1];
        local_dc = 0;
        while( true ) {
          fStack_d8 = VVar1.x;
          i = (int)VVar1.y;
          if ((int)th / 2 <= local_dc) break;
          rlColor4ub((uchar)segments_local,segments_local._1_1_,segments_local._2_1_,
                     segments_local._3_1_);
          rlTexCoord2f(texShapesRec.x / (float)texShapes.width,
                       texShapesRec.y / (float)texShapes.height);
          rlVertex2f(fStack_d8,(float)i);
          rlTexCoord2f(texShapesRec.x / (float)texShapes.width,
                       (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
          fVar3 = sinf(center.x * 0.017453292);
          fVar4 = cosf(center.x * 0.017453292);
          rlVertex2f(fVar3 * local_e0 + fStack_d8,fVar4 * local_e0 + (float)i);
          rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                       (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
          fVar3 = sinf((center.x + fVar2) * 0.017453292);
          fVar4 = cosf((center.x + fVar2) * 0.017453292);
          rlVertex2f(fVar3 * local_e0 + fStack_d8,fVar4 * local_e0 + (float)i);
          rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                       texShapesRec.y / (float)texShapes.height);
          fVar3 = sinf((fVar2 + fVar2 + center.x) * 0.017453292);
          fVar4 = cosf((fVar2 + fVar2 + center.x) * 0.017453292);
          rlVertex2f(fVar3 * local_e0 + fStack_d8,fVar4 * local_e0 + (float)i);
          center.x = fVar2 + fVar2 + center.x;
          local_dc = local_dc + 1;
        }
        if ((int)th % 2 != 0) {
          rlColor4ub((uchar)segments_local,segments_local._1_1_,segments_local._2_1_,
                     segments_local._3_1_);
          rlTexCoord2f(texShapesRec.x / (float)texShapes.width,
                       texShapesRec.y / (float)texShapes.height);
          rlVertex2f(fStack_d8,(float)i);
          rlTexCoord2f(texShapesRec.x / (float)texShapes.width,
                       (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
          fVar3 = sinf(center.x * 0.017453292);
          fVar4 = cosf(center.x * 0.017453292);
          rlVertex2f(fVar3 * local_e0 + fStack_d8,fVar4 * local_e0 + (float)i);
          rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                       (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
          fVar3 = sinf((center.x + fVar2) * 0.017453292);
          fVar4 = cosf((center.x + fVar2) * 0.017453292);
          rlVertex2f(fVar3 * local_e0 + fStack_d8,fVar4 * local_e0 + (float)i);
          rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                       texShapesRec.y / (float)texShapes.height);
          rlVertex2f(fStack_d8,(float)i);
        }
        center.y = (float)((int)center.y + 1);
      }
      rlColor4ub((uchar)segments_local,segments_local._1_1_,segments_local._2_1_,
                 segments_local._3_1_);
      rlTexCoord2f(texShapesRec.x / (float)texShapes.width,texShapesRec.y / (float)texShapes.height)
      ;
      rlVertex2f(roundness_local + local_e0,(float)color_local);
      rlTexCoord2f(texShapesRec.x / (float)texShapes.width,
                   (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
      rlVertex2f(x,y);
      rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                   (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
      rlVertex2f(x_00,y_00);
      rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                   texShapesRec.y / (float)texShapes.height);
      rlVertex2f((roundness_local + rec_local.x) - local_e0,(float)color_local);
      rlColor4ub((uchar)segments_local,segments_local._1_1_,segments_local._2_1_,
                 segments_local._3_1_);
      rlTexCoord2f(texShapesRec.x / (float)texShapes.width,texShapesRec.y / (float)texShapes.height)
      ;
      rlVertex2f(roundness_local + rec_local.x,(float)color_local + local_e0);
      rlTexCoord2f(texShapesRec.x / (float)texShapes.width,
                   (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
      rlVertex2f(x_00,y_00);
      rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                   (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
      rlVertex2f(x_01,y_01);
      rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                   texShapesRec.y / (float)texShapes.height);
      rlVertex2f(roundness_local + rec_local.x,((float)color_local + rec_local.y) - local_e0);
      rlColor4ub((uchar)segments_local,segments_local._1_1_,segments_local._2_1_,
                 segments_local._3_1_);
      rlTexCoord2f(texShapesRec.x / (float)texShapes.width,texShapesRec.y / (float)texShapes.height)
      ;
      rlVertex2f(x_02,y_02);
      rlTexCoord2f(texShapesRec.x / (float)texShapes.width,
                   (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
      rlVertex2f(roundness_local + local_e0,(float)color_local + rec_local.y);
      rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                   (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
      rlVertex2f((roundness_local + rec_local.x) - local_e0,(float)color_local + rec_local.y);
      rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                   texShapesRec.y / (float)texShapes.height);
      rlVertex2f(x_01,y_01);
      rlColor4ub((uchar)segments_local,segments_local._1_1_,segments_local._2_1_,
                 segments_local._3_1_);
      rlTexCoord2f(texShapesRec.x / (float)texShapes.width,texShapesRec.y / (float)texShapes.height)
      ;
      rlVertex2f(roundness_local,(float)color_local + local_e0);
      rlTexCoord2f(texShapesRec.x / (float)texShapes.width,
                   (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
      rlVertex2f(roundness_local,((float)color_local + rec_local.y) - local_e0);
      rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                   (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
      rlVertex2f(x_02,y_02);
      rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                   texShapesRec.y / (float)texShapes.height);
      rlVertex2f(x,y);
      rlColor4ub((uchar)segments_local,segments_local._1_1_,segments_local._2_1_,
                 segments_local._3_1_);
      rlTexCoord2f(texShapesRec.x / (float)texShapes.width,texShapesRec.y / (float)texShapes.height)
      ;
      rlVertex2f(x,y);
      rlTexCoord2f(texShapesRec.x / (float)texShapes.width,
                   (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
      rlVertex2f(x_02,y_02);
      rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                   (texShapesRec.y + texShapesRec.height) / (float)texShapes.height);
      rlVertex2f(x_01,y_01);
      rlTexCoord2f((texShapesRec.x + texShapesRec.width) / (float)texShapes.width,
                   texShapesRec.y / (float)texShapes.height);
      rlVertex2f(x_00,y_00);
      rlEnd();
      rlSetTexture(0);
    }
  }
  return;
}

Assistant:

void DrawRectangleRounded(Rectangle rec, float roundness, int segments, Color color)
{
    // Not a rounded rectangle
    if ((roundness <= 0.0f) || (rec.width < 1) || (rec.height < 1 ))
    {
        DrawRectangleRec(rec, color);
        return;
    }

    if (roundness >= 1.0f) roundness = 1.0f;

    // Calculate corner radius
    float radius = (rec.width > rec.height)? (rec.height*roundness)/2 : (rec.width*roundness)/2;
    if (radius <= 0.0f) return;

    // Calculate number of segments to use for the corners
    if (segments < 4)
    {
        // Calculate the maximum angle between segments based on the error rate (usually 0.5f)
        float th = acosf(2*powf(1 - SMOOTH_CIRCLE_ERROR_RATE/radius, 2) - 1);
        segments = (int)(ceilf(2*PI/th)/4.0f);
        if (segments <= 0) segments = 4;
    }

    float stepLength = 90.0f/(float)segments;

    /*
    Quick sketch to make sense of all of this,
    there are 9 parts to draw, also mark the 12 points we'll use

          P0____________________P1
          /|                    |\
         /1|          2         |3\
     P7 /__|____________________|__\ P2
       |   |P8                P9|   |
       | 8 |          9         | 4 |
       | __|____________________|__ |
     P6 \  |P11              P10|  / P3
         \7|          6         |5/
          \|____________________|/
          P5                    P4
    */
    // Coordinates of the 12 points that define the rounded rect
    const Vector2 point[12] = {
        {(float)rec.x + radius, rec.y}, {(float)(rec.x + rec.width) - radius, rec.y}, { rec.x + rec.width, (float)rec.y + radius },     // PO, P1, P2
        {rec.x + rec.width, (float)(rec.y + rec.height) - radius}, {(float)(rec.x + rec.width) - radius, rec.y + rec.height},           // P3, P4
        {(float)rec.x + radius, rec.y + rec.height}, { rec.x, (float)(rec.y + rec.height) - radius}, {rec.x, (float)rec.y + radius},    // P5, P6, P7
        {(float)rec.x + radius, (float)rec.y + radius}, {(float)(rec.x + rec.width) - radius, (float)rec.y + radius},                   // P8, P9
        {(float)(rec.x + rec.width) - radius, (float)(rec.y + rec.height) - radius}, {(float)rec.x + radius, (float)(rec.y + rec.height) - radius} // P10, P11
    };

    const Vector2 centers[4] = { point[8], point[9], point[10], point[11] };
    const float angles[4] = { 180.0f, 90.0f, 0.0f, 270.0f };

#if defined(SUPPORT_QUADS_DRAW_MODE)
    rlCheckRenderBatchLimit(16*segments/2 + 5*4);

    rlSetTexture(texShapes.id);

    rlBegin(RL_QUADS);
        // Draw all of the 4 corners: [1] Upper Left Corner, [3] Upper Right Corner, [5] Lower Right Corner, [7] Lower Left Corner
        for (int k = 0; k < 4; ++k) // Hope the compiler is smart enough to unroll this loop
        {
            float angle = angles[k];
            const Vector2 center = centers[k];

            // NOTE: Every QUAD actually represents two segments
            for (int i = 0; i < segments/2; i++)
            {
                rlColor4ub(color.r, color.g, color.b, color.a);
                rlTexCoord2f(texShapesRec.x/texShapes.width, texShapesRec.y/texShapes.height);
                rlVertex2f(center.x, center.y);
                rlTexCoord2f(texShapesRec.x/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
                rlVertex2f(center.x + sinf(DEG2RAD*angle)*radius, center.y + cosf(DEG2RAD*angle)*radius);
                rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
                rlVertex2f(center.x + sinf(DEG2RAD*(angle + stepLength))*radius, center.y + cosf(DEG2RAD*(angle + stepLength))*radius);
                rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, texShapesRec.y/texShapes.height);
                rlVertex2f(center.x + sinf(DEG2RAD*(angle + stepLength*2))*radius, center.y + cosf(DEG2RAD*(angle + stepLength*2))*radius);
                angle += (stepLength*2);
            }

            // NOTE: In case number of segments is odd, we add one last piece to the cake
            if (segments%2)
            {
                rlColor4ub(color.r, color.g, color.b, color.a);
                rlTexCoord2f(texShapesRec.x/texShapes.width, texShapesRec.y/texShapes.height);
                rlVertex2f(center.x, center.y);
                rlTexCoord2f(texShapesRec.x/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
                rlVertex2f(center.x + sinf(DEG2RAD*angle)*radius, center.y + cosf(DEG2RAD*angle)*radius);
                rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
                rlVertex2f(center.x + sinf(DEG2RAD*(angle + stepLength))*radius, center.y + cosf(DEG2RAD*(angle + stepLength))*radius);
                rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, texShapesRec.y/texShapes.height);
                rlVertex2f(center.x, center.y);
            }
        }

        // [2] Upper Rectangle
        rlColor4ub(color.r, color.g, color.b, color.a);
        rlTexCoord2f(texShapesRec.x/texShapes.width, texShapesRec.y/texShapes.height);
        rlVertex2f(point[0].x, point[0].y);
        rlTexCoord2f(texShapesRec.x/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
        rlVertex2f(point[8].x, point[8].y);
        rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
        rlVertex2f(point[9].x, point[9].y);
        rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, texShapesRec.y/texShapes.height);
        rlVertex2f(point[1].x, point[1].y);

        // [4] Right Rectangle
        rlColor4ub(color.r, color.g, color.b, color.a);
        rlTexCoord2f(texShapesRec.x/texShapes.width, texShapesRec.y/texShapes.height);
        rlVertex2f(point[2].x, point[2].y);
        rlTexCoord2f(texShapesRec.x/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
        rlVertex2f(point[9].x, point[9].y);
        rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
        rlVertex2f(point[10].x, point[10].y);
        rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, texShapesRec.y/texShapes.height);
        rlVertex2f(point[3].x, point[3].y);

        // [6] Bottom Rectangle
        rlColor4ub(color.r, color.g, color.b, color.a);
        rlTexCoord2f(texShapesRec.x/texShapes.width, texShapesRec.y/texShapes.height);
        rlVertex2f(point[11].x, point[11].y);
        rlTexCoord2f(texShapesRec.x/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
        rlVertex2f(point[5].x, point[5].y);
        rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
        rlVertex2f(point[4].x, point[4].y);
        rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, texShapesRec.y/texShapes.height);
        rlVertex2f(point[10].x, point[10].y);

        // [8] Left Rectangle
        rlColor4ub(color.r, color.g, color.b, color.a);
        rlTexCoord2f(texShapesRec.x/texShapes.width, texShapesRec.y/texShapes.height);
        rlVertex2f(point[7].x, point[7].y);
        rlTexCoord2f(texShapesRec.x/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
        rlVertex2f(point[6].x, point[6].y);
        rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
        rlVertex2f(point[11].x, point[11].y);
        rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, texShapesRec.y/texShapes.height);
        rlVertex2f(point[8].x, point[8].y);

        // [9] Middle Rectangle
        rlColor4ub(color.r, color.g, color.b, color.a);
        rlTexCoord2f(texShapesRec.x/texShapes.width, texShapesRec.y/texShapes.height);
        rlVertex2f(point[8].x, point[8].y);
        rlTexCoord2f(texShapesRec.x/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
        rlVertex2f(point[11].x, point[11].y);
        rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, (texShapesRec.y + texShapesRec.height)/texShapes.height);
        rlVertex2f(point[10].x, point[10].y);
        rlTexCoord2f((texShapesRec.x + texShapesRec.width)/texShapes.width, texShapesRec.y/texShapes.height);
        rlVertex2f(point[9].x, point[9].y);

    rlEnd();
    rlSetTexture(0);
#else
    rlCheckRenderBatchLimit(12*segments + 5*6); // 4 corners with 3 vertices per segment + 5 rectangles with 6 vertices each

    rlBegin(RL_TRIANGLES);

        // Draw all of the 4 corners: [1] Upper Left Corner, [3] Upper Right Corner, [5] Lower Right Corner, [7] Lower Left Corner
        for (int k = 0; k < 4; ++k) // Hope the compiler is smart enough to unroll this loop
        {
            float angle = angles[k];
            const Vector2 center = centers[k];
            for (int i = 0; i < segments; i++)
            {
                rlColor4ub(color.r, color.g, color.b, color.a);
                rlVertex2f(center.x, center.y);
                rlVertex2f(center.x + sinf(DEG2RAD*angle)*radius, center.y + cosf(DEG2RAD*angle)*radius);
                rlVertex2f(center.x + sinf(DEG2RAD*(angle + stepLength))*radius, center.y + cosf(DEG2RAD*(angle + stepLength))*radius);
                angle += stepLength;
            }
        }

        // [2] Upper Rectangle
        rlColor4ub(color.r, color.g, color.b, color.a);
        rlVertex2f(point[0].x, point[0].y);
        rlVertex2f(point[8].x, point[8].y);
        rlVertex2f(point[9].x, point[9].y);
        rlVertex2f(point[1].x, point[1].y);
        rlVertex2f(point[0].x, point[0].y);
        rlVertex2f(point[9].x, point[9].y);

        // [4] Right Rectangle
        rlColor4ub(color.r, color.g, color.b, color.a);
        rlVertex2f(point[9].x, point[9].y);
        rlVertex2f(point[10].x, point[10].y);
        rlVertex2f(point[3].x, point[3].y);
        rlVertex2f(point[2].x, point[2].y);
        rlVertex2f(point[9].x, point[9].y);
        rlVertex2f(point[3].x, point[3].y);

        // [6] Bottom Rectangle
        rlColor4ub(color.r, color.g, color.b, color.a);
        rlVertex2f(point[11].x, point[11].y);
        rlVertex2f(point[5].x, point[5].y);
        rlVertex2f(point[4].x, point[4].y);
        rlVertex2f(point[10].x, point[10].y);
        rlVertex2f(point[11].x, point[11].y);
        rlVertex2f(point[4].x, point[4].y);

        // [8] Left Rectangle
        rlColor4ub(color.r, color.g, color.b, color.a);
        rlVertex2f(point[7].x, point[7].y);
        rlVertex2f(point[6].x, point[6].y);
        rlVertex2f(point[11].x, point[11].y);
        rlVertex2f(point[8].x, point[8].y);
        rlVertex2f(point[7].x, point[7].y);
        rlVertex2f(point[11].x, point[11].y);

        // [9] Middle Rectangle
        rlColor4ub(color.r, color.g, color.b, color.a);
        rlVertex2f(point[8].x, point[8].y);
        rlVertex2f(point[11].x, point[11].y);
        rlVertex2f(point[10].x, point[10].y);
        rlVertex2f(point[9].x, point[9].y);
        rlVertex2f(point[8].x, point[8].y);
        rlVertex2f(point[10].x, point[10].y);
    rlEnd();
#endif
}